

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-feat.c
# Opt level: O0

void project_feature_handler_MAKE_DOOR(project_feature_handler_context_t *context)

{
  loc_conflict grid_00;
  _Bool _Var1;
  monster *pmVar2;
  loc_conflict grid_01;
  object *poVar3;
  loc_conflict grid1;
  wchar_t count;
  wchar_t d;
  loc_conflict grid;
  project_feature_handler_context_t *context_local;
  
  grid_00 = context->grid;
  grid1.x = L'\0';
  pmVar2 = square_monster((chunk *)cave,grid_00);
  if (((pmVar2 == (monster *)0x0) && (_Var1 = square_isplayer((chunk *)cave,grid_00), !_Var1)) &&
     (_Var1 = square_isfloor((chunk *)cave,grid_00), _Var1)) {
    for (grid1.y = L'\0'; grid1.y < L'\x04'; grid1.y = grid1.y + L'\x01') {
      grid_01 = (loc_conflict)loc_sum(player->grid,ddgrid_ddd[grid1.y << 1]);
      _Var1 = square_isstrongwall((chunk *)cave,grid_01);
      if (_Var1) {
        grid1.x = grid1.x + L'\x01';
      }
    }
    if (L'\x01' < grid1.x) {
      poVar3 = square_object((chunk *)cave,grid_00);
      if (poVar3 != (object *)0x0) {
        push_object(grid_00);
      }
      square_add_door((chunk *)cave,grid_00,true);
      _Var1 = square_isseen((chunk *)cave,grid_00);
      if (_Var1) {
        context->obvious = true;
      }
      player->upkeep->update = player->upkeep->update | 0xc0;
    }
  }
  return;
}

Assistant:

static void project_feature_handler_MAKE_DOOR(project_feature_handler_context_t *context)
{
	const struct loc grid = context->grid;
	int d, count = 0;

	/* Require a grid without monsters */
	if (square_monster(cave, grid) || square_isplayer(cave, grid)) return;

	/* Require a floor grid */
	if (!square_isfloor(cave, grid)) return;

	/* Require at least two walls in cardinal directions */
	for (d = 0; d < 4; d++) {
		struct loc grid1 = loc_sum(player->grid, ddgrid_ddd[2 * d]);
		if (square_isstrongwall(cave, grid1)) count++;
	}
	if (count < 2) return;

	/* Push objects off the grid */
	if (square_object(cave, grid))
		push_object(grid);

	/* Create closed door */
	square_add_door(cave, grid, true);

	/* Observe */
	if (square_isseen(cave, grid))
		context->obvious = true;

	/* Update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);
}